

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_test.cpp
# Opt level: O1

void test_number(void)

{
  bool bVar1;
  int iVar2;
  value_t *val;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar3;
  size_t sVar4;
  value_t *pvVar5;
  value_hash_t local_31;
  number_t local_30;
  
  deci::number_t::number_t(&local_30,100.0);
  if ((local_30.val != 100.0) || (NAN(local_30.val))) {
    __assert_fail("number_t(100.0).Value() == 100.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x11,"void test_number()");
  }
  deci::number_t::~number_t(&local_30);
  deci::number_t::number_t(&local_30,200.0);
  if ((local_30.val != 200.0) || (NAN(local_30.val))) {
    __assert_fail("number_t(200.0).Value() == 200.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x12,"void test_number()");
  }
  deci::number_t::~number_t(&local_30);
  deci::number_t::number_t(&local_30,0.0);
  if ((local_30.val != 0.0) || (NAN(local_30.val))) {
    __assert_fail("number_t(0.0).Value() == 0.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x13,"void test_number()");
  }
  deci::number_t::~number_t(&local_30);
  deci::number_t::number_t(&local_30,123.0);
  val = deci::number_t::Copy(&local_30);
  deci::number_t::~number_t(&local_30);
  iVar2 = (*val->_vptr_value_t[1])(val);
  if (iVar2 != 0) {
    __assert_fail("item->Type() == value_t::NUMBER",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x16,"void test_number()");
  }
  if ((val->hash & 1) != 0) {
    iVar2 = (**val->_vptr_value_t)(val);
    val->hash = CONCAT44(extraout_var,iVar2) & 0xfffffffffffffffe;
  }
  sVar3 = val->hash;
  deci::number_t::number_t(&local_30,123.0);
  if ((local_30.super_value_t.hash & 1) != 0) {
    iVar2 = (**local_30.super_value_t._vptr_value_t)();
    local_30.super_value_t.hash = CONCAT44(extraout_var_00,iVar2) & 0xfffffffffffffffe;
  }
  if (sVar3 == local_30.super_value_t.hash) {
    deci::number_t::~number_t(&local_30);
    iVar2 = (*val->_vptr_value_t[2])(val);
    pvVar5 = (value_t *)CONCAT44(extraout_var_01,iVar2);
    if (val == pvVar5) {
      __assert_fail("item != copy",
                    "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                    ,0x19,"void test_number()");
    }
    sVar3 = deci::value_hash_t::operator()((value_hash_t *)&local_30,val);
    sVar4 = deci::value_hash_t::operator()(&local_31,pvVar5);
    if (sVar3 != sVar4) {
      __assert_fail("value_hash_t()(item) == value_hash_t()(copy)",
                    "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                    ,0x1a,"void test_number()");
    }
    bVar1 = deci::value_equal_to_t::operator()((value_equal_to_t *)&local_30,val,pvVar5);
    if (!bVar1) {
      __assert_fail("value_equal_to_t()(item, copy) == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                    ,0x1b,"void test_number()");
    }
    (*pvVar5->_vptr_value_t[3])(pvVar5);
    deci::number_t::number_t(&local_30,100.0);
    pvVar5 = deci::number_t::Copy(&local_30);
    deci::number_t::~number_t(&local_30);
    bVar1 = deci::value_equal_to_t::operator()((value_equal_to_t *)&local_30,val,pvVar5);
    if (!bVar1) {
      (*pvVar5->_vptr_value_t[3])(pvVar5);
      (*val->_vptr_value_t[3])(val);
      return;
    }
    __assert_fail("value_equal_to_t()(item, copy) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x1f,"void test_number()");
  }
  __assert_fail("item->Hash() == number_t(123.0).Hash()",
                "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                ,0x17,"void test_number()");
}

Assistant:

void test_number() {
  using namespace deci;

  assert(number_t(100.0).Value() == 100.0);
  assert(number_t(200.0).Value() == 200.0);
  assert(number_t(0.0).Value() == 0.0);

  value_t* item = number_t(123.0).Copy();
  assert(item->Type() == value_t::NUMBER);
  assert(item->Hash() == number_t(123.0).Hash());
  value_t* copy = item->Copy();
  assert(item != copy);
  assert(value_hash_t()(item) == value_hash_t()(copy));
  assert(value_equal_to_t()(item, copy) == true);

  copy->Delete();
  copy = number_t(100.0).Copy();
  assert(value_equal_to_t()(item, copy) == false);

  copy->Delete();
  item->Delete();
}